

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::StreamingReporterBase<Catch::ConsoleReporter>::testRunStarting
          (StreamingReporterBase<Catch::ConsoleReporter> *this,TestRunInfo *_testRunInfo)

{
  LazyStat<Catch::TestRunInfo> *in_RSI;
  TestRunInfo *in_stack_ffffffffffffffe8;
  
  LazyStat<Catch::TestRunInfo>::operator=(in_RSI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

void testRunStarting(TestRunInfo const& _testRunInfo) override {
            currentTestRunInfo = _testRunInfo;
        }